

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

Type * LLVMBC::resolve_gep_element_type(Type *type,Vector<Value_*> *args)

{
  Value *value;
  bool bVar1;
  TypeID TVar2;
  uint uVar3;
  pointer ppVVar4;
  Constant *this;
  APInt *this_00;
  uint64_t uVar5;
  LoggingCallback p_Var6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  char buffer [4096];
  char acStack_1028 [32];
  undefined8 local_1008;
  char acStack_1000 [4064];
  
  ppVVar4 = (args->
            super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (0x10 < (ulong)((long)(args->
                           super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4)) {
    uVar8 = 2;
    uVar9 = 3;
    do {
      value = ppVVar4[uVar8];
      TVar2 = Type::getTypeID(type);
      if (TVar2 == StructTyID) {
        this = &dyn_cast<LLVMBC::ConstantInt>(value)->super_Constant;
        if (this == (Constant *)0x0) {
          p_Var6 = ::dxil_spv::get_thread_log_callback();
          if (p_Var6 == (LoggingCallback)0x0) {
            resolve_gep_element_type();
            return (Type *)0x0;
          }
          local_1008._0_1_ = ' ';
          local_1008._1_1_ = 'c';
          local_1008._2_1_ = 'o';
          local_1008._3_1_ = 'n';
          local_1008._4_1_ = 's';
          local_1008._5_1_ = 't';
          local_1008._6_1_ = 'a';
          local_1008._7_1_ = 'n';
          builtin_strncpy(acStack_1000,"t integer.\n",0xc);
          builtin_strncpy(acStack_1028 + 0x10,"struct without a",0x10);
          builtin_strncpy(acStack_1028,"Indexing into a ",0x10);
LAB_001826aa:
          pvVar7 = ::dxil_spv::get_thread_log_callback_userdata();
          (*p_Var6)(pvVar7,Error,acStack_1028);
          return (Type *)0x0;
        }
        this_00 = Constant::getUniqueInteger(this);
        uVar5 = APInt::getZExtValue(this_00);
        TVar2 = Type::getTypeID(type);
        if (TVar2 != StructTyID) {
          p_Var6 = ::dxil_spv::get_thread_log_callback();
          if (p_Var6 == (LoggingCallback)0x0) {
            resolve_gep_element_type();
            std::terminate();
          }
LAB_00182719:
          builtin_strncpy(acStack_1028 + 0x10,"in cast<T>.\n",0xd);
          builtin_strncpy(acStack_1028,"Invalid type ID ",0x10);
          pvVar7 = ::dxil_spv::get_thread_log_callback_userdata();
          (*p_Var6)(pvVar7,Error,acStack_1028);
          std::terminate();
        }
        uVar3 = StructType::getNumElements((StructType *)type);
        if (uVar3 <= (uint)uVar5) {
          p_Var6 = ::dxil_spv::get_thread_log_callback();
          if (p_Var6 == (LoggingCallback)0x0) {
            resolve_gep_element_type();
            return (Type *)0x0;
          }
          builtin_strncpy(acStack_1028 + 0x10,"ndex out of rang",0x10);
          builtin_strncpy(acStack_1028,"Struct element i",0x10);
          local_1008._0_4_ = 0xa2e65;
          goto LAB_001826aa;
        }
        TVar2 = Type::getTypeID(type);
        if (TVar2 != StructTyID) {
          p_Var6 = ::dxil_spv::get_thread_log_callback();
          if (p_Var6 == (LoggingCallback)0x0) {
            resolve_gep_element_type();
            std::terminate();
          }
          goto LAB_00182719;
        }
        type = StructType::getElementType((StructType *)type,(uint)uVar5);
      }
      else {
        TVar2 = Type::getTypeID(type);
        if (TVar2 == ArrayTyID) {
          type = Type::getArrayElementType(type);
        }
        else {
          TVar2 = Type::getTypeID(type);
          if (TVar2 != VectorTyID) {
            return (Type *)0x0;
          }
          TVar2 = Type::getTypeID(type);
          if (TVar2 != VectorTyID) {
            p_Var6 = ::dxil_spv::get_thread_log_callback();
            if (p_Var6 == (LoggingCallback)0x0) {
              resolve_gep_element_type();
              std::terminate();
            }
            goto LAB_00182719;
          }
          type = VectorType::getElementType((VectorType *)type);
        }
      }
      ppVVar4 = (args->
                super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar9 < (ulong)((long)(args->
                                    super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4 >> 3
                             );
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar1);
  }
  return &((StructType *)type)->super_Type;
}

Assistant:

static Type *resolve_gep_element_type(Type *type, const Vector<Value *> &args)
{
	for (unsigned i = 2; i < args.size(); i++)
	{
		auto *arg = args[i];
		if (type->getTypeID() == Type::TypeID::StructTyID)
		{
			auto *const_int = dyn_cast<ConstantInt>(arg);
			if (!const_int)
			{
				LOGE("Indexing into a struct without a constant integer.\n");
				return nullptr;
			}

			unsigned index = const_int->getUniqueInteger().getZExtValue();
			if (index >= cast<StructType>(type)->getNumElements())
			{
				LOGE("Struct element index out of range.\n");
				return nullptr;
			}
			type = cast<StructType>(type)->getElementType(index);
		}
		else if (type->getTypeID() == Type::TypeID::ArrayTyID)
		{
			type = type->getArrayElementType();
		}
		else if (type->getTypeID() == Type::TypeID::VectorTyID)
		{
			type = cast<VectorType>(type)->getElementType();
		}
		else
			return nullptr;
	}

	return type;
}